

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_ObjPatchFanin(Acb_Ntk_t *p,int iObj,int iFanin,int iFaninNew)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int *pFanins;
  int local_20;
  int RetValue;
  int i;
  int iFaninNew_local;
  int iFanin_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  piVar2 = Acb_ObjFanins(p,iObj);
  if (iFanin == iFaninNew) {
    __assert_fail("iFanin != iFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x229,"void Acb_ObjPatchFanin(Acb_Ntk_t *, int, int, int)");
  }
  for (local_20 = 0; local_20 < *piVar2; local_20 = local_20 + 1) {
    if (piVar2[local_20 + 1] == iFanin) {
      piVar2[local_20 + 1] = iFaninNew;
    }
  }
  iVar1 = Acb_NtkHasObjFanout(p);
  if (iVar1 != 0) {
    pVVar3 = Vec_WecEntry(&p->vFanouts,iFanin);
    iVar1 = Vec_IntRemove(pVVar3,iObj);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x230,"void Acb_ObjPatchFanin(Acb_Ntk_t *, int, int, int)");
    }
    pVVar3 = Vec_WecEntry(&p->vFanouts,iFaninNew);
    Vec_IntPush(pVVar3,iObj);
  }
  return;
}

Assistant:

static inline void Acb_ObjPatchFanin( Acb_Ntk_t * p, int iObj, int iFanin, int iFaninNew )
{
    int i, RetValue, * pFanins = Acb_ObjFanins( p, iObj );
    assert( iFanin != iFaninNew );
    for ( i = 0; i < pFanins[0]; i++ )
        if ( pFanins[ 1 + i ] == iFanin )
            pFanins[ 1 + i ] = iFaninNew;
    if ( !Acb_NtkHasObjFanout(p) )
        return;
    RetValue = Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
    assert( RetValue );
    Vec_IntPush( Vec_WecEntry(&p->vFanouts, iFaninNew), iObj );
}